

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int lyp_ctx_check_module(lys_module *module)

{
  byte bVar1;
  ly_ctx *ctx;
  lys_module *plVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  lys_revision *plVar8;
  lys_revision *plVar9;
  long lVar10;
  lys_revision *__s1;
  int local_44;
  uint local_34;
  
  if (module == (lys_module *)0x0) {
    __assert_fail("module",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                  ,0xdd1,"int lyp_ctx_check_module(struct lys_module *)");
  }
  ctx = module->ctx;
  bVar1 = module->rev_size;
  if (bVar1 == 0) {
    __s1 = (lys_revision *)0x0;
  }
  else {
    lVar10 = 0;
    __s1 = (lys_revision *)0x0;
    do {
      if ((__s1 == (lys_revision *)0x0) ||
         (iVar4 = strcmp(__s1->date,module->rev->date + lVar10), iVar4 < 0)) {
        __s1 = (lys_revision *)(module->rev->date + lVar10);
      }
      lVar10 = lVar10 + 0x28;
    } while ((ulong)bVar1 * 0x28 != lVar10);
  }
  if ((ctx->models).used < 1) {
    bVar3 = true;
    lVar10 = -1;
  }
  else {
    pcVar7 = __s1->date;
    if (__s1 == (lys_revision *)0x0) {
      pcVar7 = "<latest>";
    }
    local_44 = -1;
    bVar3 = false;
    iVar4 = 0;
    do {
      plVar2 = (ctx->models).list[iVar4];
      plVar8 = (lys_revision *)plVar2->name;
      plVar9 = (lys_revision *)module->name;
      iVar5 = strcmp((char *)plVar8,(char *)plVar9);
      iVar6 = iVar4;
      if (iVar5 == 0) {
        plVar8 = plVar9;
        if (bVar3) {
          bVar3 = true;
          if (iVar4 != local_44) {
            plVar9 = (lys_revision *)"<latest>";
            if (__s1 != (lys_revision *)0x0) {
              plVar9 = __s1;
            }
LAB_0012a277:
            pcVar7 = "Module \"%s@%s\" in another revision \"%s\" already implemented.";
LAB_0012a29a:
            ly_log(ctx,LY_LLERR,LY_EINVAL,pcVar7,plVar8,plVar9);
            return -1;
          }
        }
        else {
          if (plVar2->rev_size == '\0') {
            if (module->rev_size != '\0') {
              ly_log(ctx,LY_LLERR,LY_EINVAL,"Module \"%s\" without revision already in context.",
                     plVar9);
              return -1;
            }
          }
          else if (module->rev_size == '\0') {
            plVar9 = plVar2->rev;
            pcVar7 = "Module \"%s\" with revision \"%s\" already in context.";
            goto LAB_0012a29a;
          }
          if ((plVar2->rev_size == '\0' && module->rev_size == '\0') ||
             (iVar5 = strcmp(plVar2->rev->date,__s1->date), iVar5 == 0)) {
            ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Module \"%s@%s\" already in context.",plVar9,
                   pcVar7);
            plVar2 = (ctx->models).list[iVar4];
            if ((plVar2->field_0x40 & 0x40) != 0) {
              lys_set_enabled(plVar2);
            }
            if ((module->field_0x40 & 0x80) == 0) {
              return 1;
            }
            bVar3 = true;
            iVar6 = -1;
            local_44 = iVar4;
            if (((ctx->models).list[iVar4]->field_0x40 & 0x80) != 0) {
              return 1;
            }
          }
          else {
            bVar3 = false;
            if (((module->field_0x40 & 0x80) != 0) && ((plVar2->field_0x40 & 0x80) != 0)) {
              plVar9 = (lys_revision *)"<latest>";
              if (__s1 != (lys_revision *)0x0) {
                plVar9 = __s1;
              }
              goto LAB_0012a277;
            }
          }
        }
      }
      else {
        iVar4 = strcmp(plVar2->ns,module->ns);
        if (iVar4 == 0) {
          pcVar7 = "Two different modules (\"%s\" and \"%s\") have the same namespace \"%s\".";
          goto LAB_0012a29a;
        }
      }
      iVar4 = iVar6 + 1;
    } while (iVar4 < (ctx->models).used);
    bVar3 = !bVar3;
    lVar10 = (long)local_44;
  }
  local_34 = 0;
  if (!bVar3) {
    iVar4 = lys_set_implemented((ctx->models).list[lVar10]);
    local_34 = -(uint)(iVar4 != 0) | 1;
  }
  return local_34;
}

Assistant:

int
lyp_ctx_check_module(struct lys_module *module)
{
    struct ly_ctx *ctx;
    int i, match_i = -1, to_implement;
    const char *last_rev = NULL;

    assert(module);
    to_implement = 0;
    ctx = module->ctx;

    /* find latest revision */
    for (i = 0; i < module->rev_size; ++i) {
        if (!last_rev || (strcmp(last_rev, module->rev[i].date) < 0)) {
            last_rev = module->rev[i].date;
        }
    }

    for (i = 0; i < ctx->models.used; i++) {
        /* check name (name/revision) and namespace uniqueness */
        if (!strcmp(ctx->models.list[i]->name, module->name)) {
            if (to_implement) {
                if (i == match_i) {
                    continue;
                }
                LOGERR(ctx, LY_EINVAL, "Module \"%s@%s\" in another revision \"%s\" already implemented.",
                       module->name, last_rev ? last_rev : "<latest>", ctx->models.list[i]->rev[0].date);
                return -1;
            } else if (!ctx->models.list[i]->rev_size && module->rev_size) {
                LOGERR(ctx, LY_EINVAL, "Module \"%s\" without revision already in context.", module->name);
                return -1;
            } else if (ctx->models.list[i]->rev_size && !module->rev_size) {
                LOGERR(ctx, LY_EINVAL, "Module \"%s\" with revision \"%s\" already in context.",
                       module->name, ctx->models.list[i]->rev[0].date);
                return -1;
            } else if ((!module->rev_size && !ctx->models.list[i]->rev_size)
                    || !strcmp(ctx->models.list[i]->rev[0].date, last_rev)) {

                LOGVRB("Module \"%s@%s\" already in context.", module->name, last_rev ? last_rev : "<latest>");

                /* if disabled, enable first */
                if (ctx->models.list[i]->disabled) {
                    lys_set_enabled(ctx->models.list[i]);
                }

                to_implement = module->implemented;
                match_i = i;
                if (to_implement && !ctx->models.list[i]->implemented) {
                    /* check first that it is okay to change it to implemented */
                    i = -1;
                    continue;
                }
                return 1;

            } else if (module->implemented && ctx->models.list[i]->implemented) {
                LOGERR(ctx, LY_EINVAL, "Module \"%s@%s\" in another revision \"%s\" already implemented.",
                       module->name, last_rev ? last_rev : "<latest>", ctx->models.list[i]->rev[0].date);
                return -1;
            }
            /* else keep searching, for now the caller is just adding
             * another revision of an already present schema
             */
        } else if (!strcmp(ctx->models.list[i]->ns, module->ns)) {
            LOGERR(ctx, LY_EINVAL, "Two different modules (\"%s\" and \"%s\") have the same namespace \"%s\".",
                   ctx->models.list[i]->name, module->name, module->ns);
            return -1;
        }
    }

    if (to_implement) {
        if (lys_set_implemented(ctx->models.list[match_i])) {
            return -1;
        }
        return 1;
    }

    return 0;
}